

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

lws_check_basic_auth_results
lws_check_basic_auth(lws *wsi,char *basic_auth_login_file,uint auth_mode)

{
  byte bVar1;
  allocated_headers *paVar2;
  int iVar3;
  int iVar4;
  uint stringlen;
  char *pcVar5;
  char plain [120];
  char b64 [160];
  char local_158 [128];
  char local_d8 [5];
  undefined1 local_d3;
  char local_d2 [162];
  
  if (basic_auth_login_file == (char *)0x0 && auth_mode == 0) {
    return LCBA_CONTINUE;
  }
  iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
  if (iVar3 == 0) {
    return LCBA_FAILED_AUTH;
  }
  paVar2 = (wsi->http).ah;
  bVar1 = paVar2->frag_index[0x19];
  if (paVar2->frags[bVar1].nfrag != '\0') {
    _lws_log(1,"fragmented basic auth header not allowed\n");
    return LCBA_FAILED_AUTH;
  }
  iVar4 = lws_hdr_copy(wsi,local_d8,0xa0,WSI_TOKEN_HTTP_AUTHORIZATION);
  if (iVar4 < 7) {
    pcVar5 = "b64 auth too long\n";
  }
  else {
    local_d3 = 0;
    iVar4 = strcasecmp(local_d8,"Basic");
    if (iVar4 != 0) {
      _lws_log(1,"auth missing basic: %s\n",local_d8);
      return LCBA_END_TRANSACTION;
    }
    stringlen = lws_b64_decode_string(local_d2,local_158,0x77);
    if ((int)stringlen < 0) {
      pcVar5 = "plain auth too long\n";
    }
    else {
      local_158[stringlen] = '\0';
      pcVar5 = strchr(local_158,0x3a);
      if (pcVar5 != (char *)0x0) {
        if (auth_mode == 0x10000000) {
          iVar4 = (*((wsi->a).protocol)->callback)
                            (wsi,LWS_CALLBACK_VERIFY_BASIC_AUTHORIZATION,wsi->user_space,local_158,
                             (ulong)stringlen);
          if (iVar4 == 0) {
            return LCBA_FAILED_AUTH;
          }
        }
        else {
          if (auth_mode != 0) {
            return LCBA_FAILED_AUTH;
          }
          iVar4 = lws_find_string_in_file(basic_auth_login_file,local_158,stringlen);
          if (iVar4 == 0) {
            _lws_log(1,"%s: basic auth lookup failed\n","lws_check_basic_auth");
            return LCBA_FAILED_AUTH;
          }
        }
        *pcVar5 = '\0';
        ((wsi->http).ah)->frags[bVar1].len = (short)pcVar5 - (short)local_158;
        pcVar5 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
        strncpy(pcVar5,local_158,(long)iVar3 - 1U & 0xffffffff);
        pcVar5[(long)iVar3 + -1] = '\0';
        pcVar5 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_AUTHORIZATION);
        _lws_log(8,"%s: basic auth accepted for %s\n","lws_check_basic_auth",pcVar5);
        return LCBA_CONTINUE;
      }
      pcVar5 = "basic auth format broken\n";
    }
  }
  _lws_log(1,pcVar5);
  return LCBA_END_TRANSACTION;
}

Assistant:

enum lws_check_basic_auth_results
lws_check_basic_auth(struct lws *wsi, const char *basic_auth_login_file,
		     unsigned int auth_mode)
{
#if defined(LWS_WITH_FILE_OPS)
	char b64[160], plain[(sizeof(b64) * 3) / 4], *pcolon;
	int m, ml, fi, bar;

	if (!basic_auth_login_file && auth_mode == LWSAUTHM_DEFAULT)
		return LCBA_CONTINUE;

	/* Did he send auth? */
	ml = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_AUTHORIZATION);
	if (!ml)
		return LCBA_FAILED_AUTH;

	/* Disallow fragmentation monkey business */

	fi = wsi->http.ah->frag_index[WSI_TOKEN_HTTP_AUTHORIZATION];
	if (wsi->http.ah->frags[fi].nfrag) {
		lwsl_err("fragmented basic auth header not allowed\n");
		return LCBA_FAILED_AUTH;
	}

	m = lws_hdr_copy(wsi, b64, sizeof(b64),
			 WSI_TOKEN_HTTP_AUTHORIZATION);
	if (m < 7) {
		lwsl_err("b64 auth too long\n");
		return LCBA_END_TRANSACTION;
	}

	b64[5] = '\0';
	if (strcasecmp(b64, "Basic")) {
		lwsl_err("auth missing basic: %s\n", b64);
		return LCBA_END_TRANSACTION;
	}

	/* It'll be like Authorization: Basic QWxhZGRpbjpPcGVuU2VzYW1l */

	m = lws_b64_decode_string(b64 + 6, plain, sizeof(plain) - 1);
	if (m < 0) {
		lwsl_err("plain auth too long\n");
		return LCBA_END_TRANSACTION;
	}

	plain[m] = '\0';
	pcolon = strchr(plain, ':');
	if (!pcolon) {
		lwsl_err("basic auth format broken\n");
		return LCBA_END_TRANSACTION;
	}

	switch (auth_mode) {
	case LWSAUTHM_DEFAULT:
		if (lws_find_string_in_file(basic_auth_login_file, plain, m))
			break;
		lwsl_err("%s: basic auth lookup failed\n", __func__);
		return LCBA_FAILED_AUTH;

	case LWSAUTHM_BASIC_AUTH_CALLBACK:
		bar = wsi->a.protocol->callback(wsi,
				LWS_CALLBACK_VERIFY_BASIC_AUTHORIZATION,
				wsi->user_space, plain, (unsigned int)m);
		if (!bar)
			return LCBA_FAILED_AUTH;
		break;
	default:
		/* Invalid auth mode so lets fail all authentication attempts */
		return LCBA_FAILED_AUTH;
	}

	/*
	 * Rewrite WSI_TOKEN_HTTP_AUTHORIZATION so it is just the
	 * authorized username
	 */

	*pcolon = '\0';
	wsi->http.ah->frags[fi].len = (uint16_t)lws_ptr_diff_size_t(pcolon, &plain[0]);
	pcolon = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_AUTHORIZATION);
	strncpy(pcolon, plain, (unsigned int)(ml - 1));
	pcolon[ml - 1] = '\0';
	lwsl_info("%s: basic auth accepted for %s\n", __func__,
		 lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_AUTHORIZATION));

	return LCBA_CONTINUE;
#else
	return LCBA_FAILED_AUTH;
#endif
}